

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_NtkParseInt2(char *pStr,Ifn_Ntk_t *p)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  int *piVar14;
  long lVar15;
  char cVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  
  iVar6 = Ifn_ManStrCheck2(pStr,&p->nInps,&p->nObjs);
  if (iVar6 == 0) {
    iVar6 = 0;
  }
  else {
    uVar7 = p->nInps;
    uVar12 = (ulong)uVar7;
    if ((int)uVar7 < 0xc) {
      if ((((int)uVar7 < 2) || (iVar3 = p->nObjs, iVar3 <= (int)uVar7)) || (0x15 < iVar3)) {
        __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x181,"int Ifn_NtkParseInt2(char *, Ifn_Ntk_t *)");
      }
      piVar14 = p->Nodes[uVar12].Fanins;
      do {
        cVar16 = *pStr;
        iVar6 = (int)uVar12;
        if (cVar16 == '\0') {
LAB_003a6a09:
          uVar12 = (ulong)(iVar6 + 0x61);
          pcVar13 = "Cannot find definition of signal \'%c\'.\n";
          goto LAB_003a6a13;
        }
        uVar7 = 3;
        lVar15 = 0;
        pcVar13 = pStr + 3;
        while ((uVar12 + 0x61 != (ulong)(uint)(int)cVar16 || (pStr[lVar15 + 1] != '='))) {
          cVar16 = pStr[lVar15 + 1];
          lVar15 = lVar15 + 1;
          pcVar13 = pcVar13 + 1;
          uVar7 = uVar7 + 1;
          if (cVar16 == '\0') goto LAB_003a6a09;
        }
        bVar1 = pStr[lVar15 + 2];
        if (bVar1 < 0x5b) {
          if (bVar1 == 0x28) {
            cVar16 = ')';
            uVar17 = 3;
          }
          else {
            if (bVar1 != 0x3c) {
LAB_003a6a58:
              uVar12 = (ulong)(iVar6 + 0x61);
              pcVar13 = 
              "Cannot find openning operation symbol in the definition of signal \'%c\'.\n";
              goto LAB_003a6a13;
            }
            cVar16 = '>';
            uVar17 = 5;
          }
        }
        else if (bVar1 == 0x7b) {
          cVar16 = '}';
          uVar17 = 6;
        }
        else {
          if (bVar1 != 0x5b) goto LAB_003a6a58;
          cVar16 = ']';
          uVar17 = 4;
        }
        uVar4 = *(uint *)(p->Nodes + uVar12);
        *(uint *)(p->Nodes + uVar12) = uVar4 & 0xfffffff8 | uVar17;
        uVar18 = 0xf8;
        uVar5 = 0;
        iVar10 = -1;
        do {
          iVar19 = iVar10;
          uVar9 = uVar5;
          cVar2 = *pcVar13;
          uVar18 = uVar18 + 8;
          if (cVar2 == '\0') break;
          pcVar13 = pcVar13 + 1;
          uVar5 = uVar9 + 1;
          iVar10 = iVar19 + 1;
        } while (cVar16 != cVar2);
        if (cVar2 == '\0') {
          uVar12 = (ulong)(iVar6 + 0x61);
          pcVar13 = "Cannot find closing operation symbol in the definition of signal \'%c\'.\n";
LAB_003a6a13:
          Ifn_ErrorMessage(pcVar13,uVar12);
          return 0;
        }
        iVar19 = iVar19 + 4;
        if (0xb < iVar19) {
          uVar12 = (ulong)(iVar6 + 0x61);
          pcVar13 = "Cannot find matching operation symbol in the definition of signal \'%c\'.\n";
          goto LAB_003a6a13;
        }
        if (3 < iVar19) {
          uVar8 = 0;
          do {
            if ((pStr[uVar8 + uVar7] < 0x61) ||
               (iVar10 = pStr[uVar8 + uVar7] + -0x61, iVar6 <= iVar10)) {
              uVar11 = (ulong)(iVar6 + 0x61);
              pcVar13 = "Fanin number %d is signal %d is out of range.\n";
              uVar12 = uVar8 & 0xffffffff;
              goto LAB_003a6867;
            }
            piVar14[uVar8] = iVar10;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
        *(uint *)(p->Nodes + uVar12) = uVar4 & 0xffffff00 | uVar17 | uVar18 & 0xf8;
        uVar12 = uVar12 + 1;
        piVar14 = piVar14 + 0xc;
        iVar6 = 1;
      } while ((int)uVar12 < iVar3);
    }
    else {
      pcVar13 = 
      "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
      ;
      uVar11 = 0xb;
LAB_003a6867:
      iVar6 = 0;
      Ifn_ErrorMessage(pcVar13,uVar12,uVar11);
    }
  }
  return iVar6;
}

Assistant:

int Ifn_NtkParseInt2( char * pStr, Ifn_Ntk_t * p )
{
    int i, k, n, f, nFans, iFan;
    if ( !Ifn_ManStrCheck2(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        char Next = 0;
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'a' + i && pStr[k+1] == '=' )
                break;
        if ( pStr[k] == 0 )
            return Ifn_ErrorMessage( "Cannot find definition of signal \'%c\'.\n", 'a' + i );
        if ( pStr[k+2] == '(' )
            p->Nodes[i].Type = IFN_DSD_AND, Next = ')';
        else if ( pStr[k+2] == '[' )
            p->Nodes[i].Type = IFN_DSD_XOR, Next = ']';
        else if ( pStr[k+2] == '<' )
            p->Nodes[i].Type = IFN_DSD_MUX, Next = '>';
        else if ( pStr[k+2] == '{' )
            p->Nodes[i].Type = IFN_DSD_PRIME, Next = '}';
        else 
            return Ifn_ErrorMessage( "Cannot find openning operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( n = k + 3; pStr[n]; n++ )
            if ( pStr[n] == Next )
                break;
        if ( pStr[n] == 0 )
            return Ifn_ErrorMessage( "Cannot find closing operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        nFans = n - k - 3;
        if ( nFans > 8 )
            return Ifn_ErrorMessage( "Cannot find matching operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( f = 0; f < nFans; f++ )
        {
            iFan = pStr[k + 3 + f] - 'a';
            if ( iFan < 0 || iFan >= i )
                return Ifn_ErrorMessage( "Fanin number %d is signal %d is out of range.\n", f, 'a' + i );
            p->Nodes[i].Fanins[f] = iFan;
        }
        p->Nodes[i].nFanins = nFans;
    }
    return 1;
}